

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O0

void cfl_store_block(MACROBLOCKD *xd,BLOCK_SIZE bsize,TX_SIZE tx_size)

{
  TX_SIZE TVar1;
  int width_00;
  byte in_SIL;
  MACROBLOCKD *in_RDI;
  int unaff_retaddr;
  int height;
  int width;
  int col;
  int row;
  macroblockd_plane *pd;
  CFL_CTX *cfl;
  int in_stack_ffffffffffffffa8;
  BLOCK_SIZE in_stack_ffffffffffffffaf;
  MACROBLOCKD *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffcc;
  TX_SIZE tx_size_00;
  int col_00;
  macroblockd_plane *pmVar2;
  CFL_CTX *cfl_00;
  undefined6 in_stack_fffffffffffffff0;
  
  cfl_00 = &in_RDI->cfl;
  pmVar2 = in_RDI->plane;
  col_00 = 0;
  tx_size_00 = '\0';
  if ((block_size_high[in_SIL] == '\x04') || (block_size_wide[in_SIL] == '\x04')) {
    tx_size_00 = '\0';
    sub8x8_adjust_offset
              (cfl_00,in_RDI->mi_row,in_RDI->mi_col,(int *)&stack0xffffffffffffffdc,
               (int *)&stack0xffffffffffffffd8);
  }
  max_intra_block_width
            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8,'\0');
  width_00 = max_intra_block_height
                       (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffaf,
                        in_stack_ffffffffffffffa8,'\0');
  TVar1 = get_tx_size(width_00,in_stack_ffffffffffffffcc);
  is_cur_buf_hbd(in_RDI);
  cfl_store((CFL_CTX *)CONCAT17(in_SIL,CONCAT16(TVar1,in_stack_fffffffffffffff0)),(uint8_t *)cfl_00,
            (int)((ulong)pmVar2 >> 0x20),(int)pmVar2,col_00,tx_size_00,unaff_retaddr);
  return;
}

Assistant:

void cfl_store_block(MACROBLOCKD *const xd, BLOCK_SIZE bsize, TX_SIZE tx_size) {
  CFL_CTX *const cfl = &xd->cfl;
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  int row = 0;
  int col = 0;

  if (block_size_high[bsize] == 4 || block_size_wide[bsize] == 4) {
    sub8x8_adjust_offset(cfl, xd->mi_row, xd->mi_col, &row, &col);
  }
  const int width = max_intra_block_width(xd, bsize, AOM_PLANE_Y, tx_size);
  const int height = max_intra_block_height(xd, bsize, AOM_PLANE_Y, tx_size);
  tx_size = get_tx_size(width, height);
  cfl_store(cfl, pd->dst.buf, pd->dst.stride, row, col, tx_size,
            is_cur_buf_hbd(xd));
}